

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpndrv.h
# Opt level: O2

void __thiscall CTcSymMetaclassBase::~CTcSymMetaclassBase(CTcSymMetaclassBase *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

CTcSymMetaclassBase(const char *str, size_t len, int copy,
                        int meta_idx, tctarg_obj_id_t class_obj)
        : CTcSymbol(str, len, copy, TC_SYM_METACLASS)
    {
        /* remember the metaclass dependency list index */
        meta_idx_ = meta_idx;

        /* we have no properties in our list yet */
        prop_head_ = 0;
        prop_tail_ = 0;
        prop_cnt_ = 0;

        /* remember my class object */
        class_obj_ = class_obj;

        /* we have no modification object yet */
        mod_obj_ = 0;

        /* we don't have a superclass yet */
        super_meta_ = 0;

        /* assume it's not an external symbol */
        ext_ = FALSE;

        /* not yet referenced */
        ref_ = FALSE;
    }